

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O2

void ut::are_equal<agge::point<float>,4ul,agge::pod_vector<agge::point<float>>>
               (point<float> (*expected) [4],pod_vector<agge::point<float>_> *actual,
               LocationInfo *location)

{
  bool value;
  unsigned_long local_28 [2];
  
  local_28[1] = 4;
  local_28[0] = (long)actual->_end - (long)actual->_begin >> 3;
  are_equal<unsigned_long,unsigned_long>(local_28 + 1,local_28,location);
  value = std::__equal<false>::equal<agge::point<float>*,agge::point<float>const*>
                    (*expected,expected[1],actual->_begin);
  is_true(value,location);
  return;
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}